

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_parse_unary(JSParseState *s,int parse_flags)

{
  byte bVar1;
  uint uVar2;
  JSAtom atom;
  int iVar3;
  JSFunctionDef *pJVar4;
  uint8_t *puVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  uint8_t val;
  char *pcVar9;
  JSContext *ctx;
  JSRefCountHeader *p;
  JSValue val_00;
  int opcode;
  JSAtom name;
  int label;
  int scope;
  
  uVar2 = (s->token).val;
  if ((int)uVar2 < -0x28) {
    if ((int)uVar2 < -0x4c) {
      if (1 < uVar2 + 0x6c) {
        if (uVar2 != 0xffffffb3) goto LAB_0015b5c6;
        pJVar4 = s->cur_func;
        iVar6 = next_token(s);
        if (iVar6 != 0) {
          return -1;
        }
        iVar6 = js_parse_unary(s,0x10);
        if (iVar6 != 0) {
          return -1;
        }
        sVar8 = (size_t)pJVar4->last_opcode_pos;
        if (-1 < (long)sVar8) {
          puVar5 = (pJVar4->byte_code).buf;
          bVar1 = puVar5[sVar8];
          if (bVar1 < 0x4a) {
            if (bVar1 == 0x41) {
              atom = *(JSAtom *)(puVar5 + sVar8 + 1);
              (pJVar4->byte_code).size = sVar8;
              pJVar4->last_opcode_pos = -1;
              val_00 = __JS_AtomToValue(s->ctx,atom,0);
              iVar6 = emit_push_const(s,val_00,1);
              ctx = s->ctx;
              if ((0xfffffff4 < (uint)val_00.tag) &&
                 (iVar3 = *val_00.u.ptr, *(int *)val_00.u.ptr = iVar3 + -1, iVar3 < 2)) {
                __JS_FreeValueRT(ctx->rt,val_00);
                ctx = s->ctx;
              }
              JS_FreeAtom(ctx,atom);
              if (iVar6 != 0) {
                return -1;
              }
            }
            else {
              if (bVar1 != 0x47) goto LAB_0015b804;
              (pJVar4->byte_code).size = sVar8;
              pJVar4->last_opcode_pos = -1;
            }
            val = 0x98;
            goto LAB_0015b898;
          }
          if (bVar1 == 0x4a) {
            emit_op(s,'0');
            opcode = 0;
            dbuf_put(&s->cur_func->byte_code,(uint8_t *)&opcode,4);
            dbuf_putc(&s->cur_func->byte_code,'\x03');
            return 0;
          }
          if (bVar1 == 0xb6) {
            if ((*(int *)(puVar5 + sVar8 + 1) != 8) && (*(int *)(puVar5 + sVar8 + 1) != 0x71)) {
              if ((pJVar4->js_mode & 1) == 0) {
                puVar5[sVar8] = 0xb8;
                return 0;
              }
              pcVar9 = "cannot delete a direct reference in strict mode";
              goto LAB_0015b59a;
            }
          }
          else if (bVar1 == 0xbc) {
            pcVar9 = "cannot delete a private class field";
LAB_0015b59a:
            js_parse_error(s,pcVar9);
            return -1;
          }
        }
LAB_0015b804:
        emit_op(s,'\x0e');
        val = '\n';
        goto LAB_0015b898;
      }
      iVar6 = next_token(s);
      if (iVar6 != 0) {
        return -1;
      }
      iVar6 = js_parse_unary(s,0);
      if (iVar6 != 0) {
        return -1;
      }
      iVar6 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,1,uVar2);
      if (iVar6 != 0) {
        return -1;
      }
      emit_op(s,(char)uVar2 + 0xfa);
      put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_TOP,0);
    }
    else {
      if (uVar2 == 0xffffffb4) goto LAB_0015b4b7;
      if (uVar2 == 0xffffffb5) {
        iVar6 = next_token(s);
        if (iVar6 != 0) {
          return -1;
        }
        iVar6 = js_parse_unary(s,0x10);
        if (iVar6 != 0) {
          return -1;
        }
        lVar7 = (long)s->cur_func->last_opcode_pos;
        if ((-1 < lVar7) && (puVar5 = (s->cur_func->byte_code).buf, puVar5[lVar7] == 0xb6)) {
          puVar5[lVar7] = 0xb5;
        }
        val = 0x97;
        goto LAB_0015b898;
      }
LAB_0015b5c6:
      iVar6 = js_parse_postfix_expr(s,parse_flags & 4U | 2);
      if (iVar6 != 0) {
        return -1;
      }
      if ((s->got_lf == 0) && (uVar2 = (s->token).val, (uVar2 & 0xfffffffe) == 0xffffff94)) {
        iVar6 = get_lvalue(s,&opcode,&scope,&name,&label,(int *)0x0,1,uVar2);
        if (iVar6 != 0) {
          return -1;
        }
        emit_op(s,(char)uVar2 + 0xfc);
        put_lvalue(s,opcode,scope,name,label,PUT_LVALUE_KEEP_SECOND,0);
        iVar6 = next_token(s);
        if (iVar6 != 0) {
          return -1;
        }
      }
    }
    if ((parse_flags & 0x18U) == 0) {
      return 0;
    }
    if ((s->token).val != -0x5d) {
      return 0;
    }
    if ((parse_flags & 0x10U) != 0) {
      JS_ThrowSyntaxError(s->ctx,
                          "unparenthesized unary expression can\'t appear on the left-hand side of \'**\'"
                         );
      return -1;
    }
    iVar6 = next_token(s);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = js_parse_unary(s,8);
    if (iVar6 != 0) {
      return -1;
    }
    val = 0x9f;
  }
  else {
    if ((0x2d < uVar2) || ((0x280200000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      if (uVar2 == 0xffffffd8) {
        if ((s->cur_func->field_0x84 & 2) == 0) {
          pcVar9 = "unexpected \'await\' keyword";
        }
        else {
          if (s->cur_func->in_function_body != 0) {
            iVar6 = next_token(s);
            if (iVar6 != 0) {
              return -1;
            }
            iVar6 = js_parse_unary(s,0x10);
            if (iVar6 != 0) {
              return -1;
            }
            val = 0x8b;
            goto LAB_0015b898;
          }
          pcVar9 = "await in default expression";
        }
        js_parse_error(s,pcVar9);
        return -1;
      }
      if (uVar2 != 0x7e) goto LAB_0015b5c6;
    }
LAB_0015b4b7:
    iVar6 = next_token(s);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = js_parse_unary(s,0x10);
    if (iVar6 != 0) {
      return -1;
    }
    if ((int)uVar2 < 0x2b) {
      if (uVar2 == 0xffffffb4) {
        emit_op(s,'\x0e');
        val = '\x06';
      }
      else {
        if (uVar2 != 0x21) {
LAB_0015b8cc:
          abort();
        }
        val = 0x96;
      }
    }
    else if (uVar2 == 0x2b) {
      val = 0x8d;
    }
    else if (uVar2 == 0x7e) {
      val = 0x95;
    }
    else {
      if (uVar2 != 0x2d) goto LAB_0015b8cc;
      val = 0x8c;
    }
  }
LAB_0015b898:
  emit_op(s,val);
  return 0;
}

Assistant:

static __exception int js_parse_unary(JSParseState *s, int parse_flags)
{
    int op;

    switch(s->token.val) {
    case '+':
    case '-':
    case '!':
    case '~':
    case TOK_VOID:
        op = s->token.val;
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        switch(op) {
        case '-':
            emit_op(s, OP_neg);
            break;
        case '+':
            emit_op(s, OP_plus);
            break;
        case '!':
            emit_op(s, OP_lnot);
            break;
        case '~':
            emit_op(s, OP_not);
            break;
        case TOK_VOID:
            emit_op(s, OP_drop);
            emit_op(s, OP_undefined);
            break;
        default:
            abort();
        }
        parse_flags = 0;
        break;
    case TOK_DEC:
    case TOK_INC:
        {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, 0))
                return -1;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_TOP,
                       FALSE);
        }
        break;
    case TOK_TYPEOF:
        {
            JSFunctionDef *fd;
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_FORBIDDEN))
                return -1;
            /* reference access should not return an exception, so we
               patch the get_var */
            fd = s->cur_func;
            if (get_prev_opcode(fd) == OP_scope_get_var) {
                fd->byte_code.buf[fd->last_opcode_pos] = OP_scope_get_var_undef;
            }
            emit_op(s, OP_typeof);
            parse_flags = 0;
        }
        break;
    case TOK_DELETE:
        if (js_parse_delete(s))
            return -1;
        parse_flags = 0;
        break;
    case TOK_AWAIT:
        if (!(s->cur_func->func_kind & JS_FUNC_ASYNC))
            return js_parse_error(s, "unexpected 'await' keyword");
        if (!s->cur_func->in_function_body)
            return js_parse_error(s, "await in default expression");
        if (next_token(s))
            return -1;
        if (js_parse_unary(s, PF_POW_FORBIDDEN))
            return -1;
        emit_op(s, OP_await);
        parse_flags = 0;
        break;
    default:
        if (js_parse_postfix_expr(s, (parse_flags & PF_ARROW_FUNC) |
                                  PF_POSTFIX_CALL))
            return -1;
        if (!s->got_lf &&
            (s->token.val == TOK_DEC || s->token.val == TOK_INC)) {
            int opcode, op, scope, label;
            JSAtom name;
            op = s->token.val;
            if (get_lvalue(s, &opcode, &scope, &name, &label, NULL, TRUE, op))
                return -1;
            emit_op(s, OP_post_dec + op - TOK_DEC);
            put_lvalue(s, opcode, scope, name, label, PUT_LVALUE_KEEP_SECOND,
                       FALSE);
            if (next_token(s))
                return -1;        
        }
        break;
    }
    if (parse_flags & (PF_POW_ALLOWED | PF_POW_FORBIDDEN)) {
#ifdef CONFIG_BIGNUM
        if (s->token.val == TOK_POW || s->token.val == TOK_MATH_POW) {
            /* Extended exponentiation syntax rules: we extend the ES7
               grammar in order to have more intuitive semantics:
               -2**2 evaluates to -4. */
            if (!(s->cur_func->js_mode & JS_MODE_MATH)) {
                if (parse_flags & PF_POW_FORBIDDEN) {
                    JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                    return -1;
                }
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#else
        if (s->token.val == TOK_POW) {
            /* Strict ES7 exponentiation syntax rules: To solve
               conficting semantics between different implementations
               regarding the precedence of prefix operators and the
               postifx exponential, ES7 specifies that -2**2 is a
               syntax error. */
            if (parse_flags & PF_POW_FORBIDDEN) {
                JS_ThrowSyntaxError(s->ctx, "unparenthesized unary expression can't appear on the left-hand side of '**'");
                return -1;
            }
            if (next_token(s))
                return -1;
            if (js_parse_unary(s, PF_POW_ALLOWED))
                return -1;
            emit_op(s, OP_pow);
        }
#endif
    }
    return 0;
}